

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMvMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Scene *pSVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  byte bVar6;
  undefined1 auVar7 [32];
  ulong uVar8;
  undefined1 auVar9 [16];
  int iVar10;
  AABBNodeMB4D *node1;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  ulong *puVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar44;
  float fVar45;
  float fVar46;
  undefined1 auVar43 [64];
  undefined1 auVar47 [16];
  uint uVar49;
  uint uVar50;
  uint uVar51;
  undefined1 auVar48 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  ulong *local_15d8;
  RTCFilterFunctionNArguments local_1570;
  undefined1 local_1540 [32];
  undefined1 local_1510 [16];
  undefined1 local_1500 [16];
  undefined1 local_14f0 [16];
  undefined1 local_14e0 [16];
  undefined1 local_14d0 [16];
  undefined1 local_14b0 [16];
  float local_14a0 [4];
  undefined1 local_1490 [16];
  float local_1480 [4];
  undefined1 local_1470 [16];
  undefined1 local_1460 [16];
  undefined1 local_1450 [16];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  RTCHitN local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined4 local_12a0;
  undefined4 uStack_129c;
  undefined4 uStack_1298;
  undefined4 uStack_1294;
  undefined4 uStack_1290;
  undefined4 uStack_128c;
  undefined4 uStack_1288;
  undefined4 uStack_1284;
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  uint local_1240;
  uint uStack_123c;
  uint uStack_1238;
  uint uStack_1234;
  uint uStack_1230;
  uint uStack_122c;
  uint uStack_1228;
  uint uStack_1224;
  uint local_1220;
  uint uStack_121c;
  uint uStack_1218;
  uint uStack_1214;
  uint uStack_1210;
  uint uStack_120c;
  uint uStack_1208;
  uint uStack_1204;
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1200 = root.ptr;
  fVar40 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1340._4_4_ = fVar40;
  local_1340._0_4_ = fVar40;
  local_1340._8_4_ = fVar40;
  local_1340._12_4_ = fVar40;
  local_1340._16_4_ = fVar40;
  local_1340._20_4_ = fVar40;
  local_1340._24_4_ = fVar40;
  local_1340._28_4_ = fVar40;
  auVar30 = ZEXT3264(local_1340);
  fVar44 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1360._4_4_ = fVar44;
  local_1360._0_4_ = fVar44;
  local_1360._8_4_ = fVar44;
  local_1360._12_4_ = fVar44;
  local_1360._16_4_ = fVar44;
  local_1360._20_4_ = fVar44;
  local_1360._24_4_ = fVar44;
  local_1360._28_4_ = fVar44;
  auVar31 = ZEXT3264(local_1360);
  fVar45 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_1380._4_4_ = fVar45;
  local_1380._0_4_ = fVar45;
  local_1380._8_4_ = fVar45;
  local_1380._12_4_ = fVar45;
  local_1380._16_4_ = fVar45;
  local_1380._20_4_ = fVar45;
  local_1380._24_4_ = fVar45;
  local_1380._28_4_ = fVar45;
  auVar35 = ZEXT3264(local_1380);
  fVar40 = fVar40 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar44 = fVar44 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar45 = fVar45 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar14 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_13a0._0_8_ = CONCAT44(fVar40,fVar40) ^ 0x8000000080000000;
  local_13a0._8_4_ = -fVar40;
  local_13a0._12_4_ = -fVar40;
  local_13a0._16_4_ = -fVar40;
  local_13a0._20_4_ = -fVar40;
  local_13a0._24_4_ = -fVar40;
  local_13a0._28_4_ = -fVar40;
  auVar39 = ZEXT3264(local_13a0);
  local_13c0._0_8_ = CONCAT44(fVar44,fVar44) ^ 0x8000000080000000;
  local_13c0._8_4_ = -fVar44;
  local_13c0._12_4_ = -fVar44;
  local_13c0._16_4_ = -fVar44;
  local_13c0._20_4_ = -fVar44;
  local_13c0._24_4_ = -fVar44;
  local_13c0._28_4_ = -fVar44;
  auVar43 = ZEXT3264(local_13c0);
  local_13e0._0_8_ = CONCAT44(fVar45,fVar45) ^ 0x8000000080000000;
  local_13e0._8_4_ = -fVar45;
  local_13e0._12_4_ = -fVar45;
  local_13e0._16_4_ = -fVar45;
  local_13e0._20_4_ = -fVar45;
  local_13e0._24_4_ = -fVar45;
  local_13e0._28_4_ = -fVar45;
  auVar48 = ZEXT3264(local_13e0);
  iVar10 = (tray->tnear).field_0.i[k];
  local_1400._4_4_ = iVar10;
  local_1400._0_4_ = iVar10;
  local_1400._8_4_ = iVar10;
  local_1400._12_4_ = iVar10;
  local_1400._16_4_ = iVar10;
  local_1400._20_4_ = iVar10;
  local_1400._24_4_ = iVar10;
  local_1400._28_4_ = iVar10;
  auVar53 = ZEXT3264(local_1400);
  iVar10 = (tray->tfar).field_0.i[k];
  local_1420._4_4_ = iVar10;
  local_1420._0_4_ = iVar10;
  local_1420._8_4_ = iVar10;
  local_1420._12_4_ = iVar10;
  local_1420._16_4_ = iVar10;
  local_1420._20_4_ = iVar10;
  local_1420._24_4_ = iVar10;
  local_1420._28_4_ = iVar10;
  auVar56 = ZEXT3264(local_1420);
  iVar10 = 1 << ((uint)k & 0x1f);
  auVar24._4_4_ = iVar10;
  auVar24._0_4_ = iVar10;
  auVar24._8_4_ = iVar10;
  auVar24._12_4_ = iVar10;
  auVar24._16_4_ = iVar10;
  auVar24._20_4_ = iVar10;
  auVar24._24_4_ = iVar10;
  auVar24._28_4_ = iVar10;
  auVar7 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar24 = vpand_avx2(auVar24,auVar7);
  local_1440 = vpcmpeqd_avx2(auVar24,auVar7);
  local_15d8 = local_11f8;
LAB_016cbfaf:
  do {
    puVar19 = local_15d8;
    if (puVar19 == &local_1200) {
LAB_016cc76b:
      return puVar19 != &local_1200;
    }
    local_15d8 = puVar19 + -1;
    uVar12 = puVar19[-1];
    while ((uVar12 & 8) == 0) {
      uVar11 = uVar12 & 0xfffffffffffffff0;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar25._4_4_ = uVar1;
      auVar25._0_4_ = uVar1;
      auVar25._8_4_ = uVar1;
      auVar25._12_4_ = uVar1;
      auVar25._16_4_ = uVar1;
      auVar25._20_4_ = uVar1;
      auVar25._24_4_ = uVar1;
      auVar25._28_4_ = uVar1;
      auVar41 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar11 + 0x100 + uVar20),auVar25,
                                *(undefined1 (*) [32])(uVar11 + 0x40 + uVar20));
      auVar41 = vfmadd213ps_fma(ZEXT1632(auVar41),auVar30._0_32_,auVar39._0_32_);
      auVar22 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar11 + 0x100 + uVar21),auVar25,
                                *(undefined1 (*) [32])(uVar11 + 0x40 + uVar21));
      auVar22 = vfmadd213ps_fma(ZEXT1632(auVar22),auVar31._0_32_,auVar43._0_32_);
      auVar24 = vpmaxsd_avx2(ZEXT1632(auVar41),ZEXT1632(auVar22));
      auVar41 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar11 + 0x100 + uVar14),auVar25,
                                *(undefined1 (*) [32])(uVar11 + 0x40 + uVar14));
      auVar41 = vfmadd213ps_fma(ZEXT1632(auVar41),auVar35._0_32_,auVar48._0_32_);
      auVar7 = vpmaxsd_avx2(ZEXT1632(auVar41),auVar53._0_32_);
      auVar41 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar11 + 0x100 + (uVar20 ^ 0x20)),auVar25,
                                *(undefined1 (*) [32])(uVar11 + 0x40 + (uVar20 ^ 0x20)));
      auVar24 = vpmaxsd_avx2(auVar24,auVar7);
      auVar22 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar11 + 0x100 + (uVar21 ^ 0x20)),auVar25,
                                *(undefined1 (*) [32])(uVar11 + 0x40 + (uVar21 ^ 0x20)));
      auVar41 = vfmadd213ps_fma(ZEXT1632(auVar41),auVar30._0_32_,auVar39._0_32_);
      auVar22 = vfmadd213ps_fma(ZEXT1632(auVar22),auVar31._0_32_,auVar43._0_32_);
      auVar7 = vpminsd_avx2(ZEXT1632(auVar41),ZEXT1632(auVar22));
      auVar41 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar11 + 0x100 + (uVar14 ^ 0x20)),auVar25,
                                *(undefined1 (*) [32])(uVar11 + 0x40 + (uVar14 ^ 0x20)));
      auVar41 = vfmadd213ps_fma(ZEXT1632(auVar41),auVar35._0_32_,auVar48._0_32_);
      auVar28 = vpminsd_avx2(ZEXT1632(auVar41),auVar56._0_32_);
      auVar7 = vpminsd_avx2(auVar7,auVar28);
      auVar24 = vcmpps_avx(auVar24,auVar7,2);
      if (((uint)uVar12 & 7) == 6) {
        auVar7 = vcmpps_avx(*(undefined1 (*) [32])(uVar11 + 0x1c0),auVar25,2);
        auVar28 = vcmpps_avx(auVar25,*(undefined1 (*) [32])(uVar11 + 0x1e0),1);
        auVar7 = vandps_avx(auVar7,auVar28);
        auVar24 = vandps_avx(auVar7,auVar24);
        auVar41 = vpackssdw_avx(auVar24._0_16_,auVar24._16_16_);
      }
      else {
        auVar41 = vpackssdw_avx(auVar24._0_16_,auVar24._16_16_);
      }
      auVar22 = vpsllw_avx(auVar41,0xf);
      auVar41 = vpacksswb_avx(auVar22,auVar22);
      bVar6 = SUB161(auVar41 >> 7,0) & 1 | (SUB161(auVar41 >> 0xf,0) & 1) << 1 |
              (SUB161(auVar41 >> 0x17,0) & 1) << 2 | (SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
              (SUB161(auVar41 >> 0x27,0) & 1) << 4 | (SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
              (SUB161(auVar41 >> 0x37,0) & 1) << 6 | SUB161(auVar41 >> 0x3f,0) << 7;
      if ((((((((auVar22 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar22 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar22 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar22 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar22 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar22 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar22 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar22[0xf])
      goto LAB_016cbfaf;
      lVar18 = 0;
      for (uVar12 = (ulong)bVar6; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
        lVar18 = lVar18 + 1;
      }
      uVar12 = *(ulong *)(uVar11 + lVar18 * 8);
      uVar16 = bVar6 - 1 & (uint)bVar6;
      uVar17 = (ulong)uVar16;
      if (uVar16 != 0) {
        do {
          *local_15d8 = uVar12;
          local_15d8 = local_15d8 + 1;
          lVar18 = 0;
          for (uVar12 = uVar17; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
            lVar18 = lVar18 + 1;
          }
          uVar17 = uVar17 - 1 & uVar17;
          uVar12 = *(ulong *)(uVar11 + lVar18 * 8);
        } while (uVar17 != 0);
      }
    }
    uVar11 = uVar12 & 0xfffffffffffffff0;
    for (lVar18 = 0; lVar18 != (ulong)((uint)uVar12 & 0xf) - 8; lVar18 = lVar18 + 1) {
      lVar13 = lVar18 * 0x140;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar22._4_4_ = uVar1;
      auVar22._0_4_ = uVar1;
      auVar22._8_4_ = uVar1;
      auVar22._12_4_ = uVar1;
      auVar38 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x90 + lVar13),auVar22,
                                *(undefined1 (*) [16])(uVar11 + lVar13));
      auVar27 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0xa0 + lVar13),auVar22,
                                *(undefined1 (*) [16])(uVar11 + 0x10 + lVar13));
      auVar9 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0xb0 + lVar13),auVar22,
                               *(undefined1 (*) [16])(uVar11 + 0x20 + lVar13));
      auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0xc0 + lVar13),auVar22,
                                *(undefined1 (*) [16])(uVar11 + 0x30 + lVar13));
      auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0xd0 + lVar13),auVar22,
                                *(undefined1 (*) [16])(uVar11 + 0x40 + lVar13));
      auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0xe0 + lVar13),auVar22,
                                *(undefined1 (*) [16])(uVar11 + 0x50 + lVar13));
      auVar55 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0xf0 + lVar13),auVar22,
                                *(undefined1 (*) [16])(uVar11 + 0x60 + lVar13));
      auVar29 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x100 + lVar13),auVar22,
                                *(undefined1 (*) [16])(uVar11 + 0x70 + lVar13));
      auVar23 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x110 + lVar13),auVar22,
                                *(undefined1 (*) [16])(uVar11 + 0x80 + lVar13));
      auVar22 = vsubps_avx(auVar38,auVar41);
      auVar41 = vsubps_avx(auVar27,auVar33);
      auVar33 = vsubps_avx(auVar9,auVar42);
      auVar42 = vsubps_avx(auVar55,auVar38);
      auVar55 = vsubps_avx(auVar29,auVar27);
      auVar29 = vsubps_avx(auVar23,auVar9);
      auVar23._0_4_ = auVar41._0_4_ * auVar29._0_4_;
      auVar23._4_4_ = auVar41._4_4_ * auVar29._4_4_;
      auVar23._8_4_ = auVar41._8_4_ * auVar29._8_4_;
      auVar23._12_4_ = auVar41._12_4_ * auVar29._12_4_;
      local_1470 = vfmsub231ps_fma(auVar23,auVar55,auVar33);
      auVar26._0_4_ = auVar33._0_4_ * auVar42._0_4_;
      auVar26._4_4_ = auVar33._4_4_ * auVar42._4_4_;
      auVar26._8_4_ = auVar33._8_4_ * auVar42._8_4_;
      auVar26._12_4_ = auVar33._12_4_ * auVar42._12_4_;
      local_1460 = vfmsub231ps_fma(auVar26,auVar29,auVar22);
      uVar1 = *(undefined4 *)(ray + k * 4);
      auVar36._4_4_ = uVar1;
      auVar36._0_4_ = uVar1;
      auVar36._8_4_ = uVar1;
      auVar36._12_4_ = uVar1;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar59._4_4_ = uVar1;
      auVar59._0_4_ = uVar1;
      auVar59._8_4_ = uVar1;
      auVar59._12_4_ = uVar1;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar62._4_4_ = uVar1;
      auVar62._0_4_ = uVar1;
      auVar62._8_4_ = uVar1;
      auVar62._12_4_ = uVar1;
      fVar40 = *(float *)(ray + k * 4 + 0x80);
      auVar54._4_4_ = fVar40;
      auVar54._0_4_ = fVar40;
      auVar54._8_4_ = fVar40;
      auVar54._12_4_ = fVar40;
      auVar38 = vsubps_avx(auVar38,auVar36);
      fVar44 = *(float *)(ray + k * 4 + 0xa0);
      auVar58._4_4_ = fVar44;
      auVar58._0_4_ = fVar44;
      auVar58._8_4_ = fVar44;
      auVar58._12_4_ = fVar44;
      auVar27 = vsubps_avx(auVar27,auVar59);
      fVar45 = *(float *)(ray + k * 4 + 0xc0);
      auVar60._4_4_ = fVar45;
      auVar60._0_4_ = fVar45;
      auVar60._8_4_ = fVar45;
      auVar60._12_4_ = fVar45;
      auVar9 = vsubps_avx(auVar9,auVar62);
      auVar32._0_4_ = fVar40 * auVar27._0_4_;
      auVar32._4_4_ = fVar40 * auVar27._4_4_;
      auVar32._8_4_ = fVar40 * auVar27._8_4_;
      auVar32._12_4_ = fVar40 * auVar27._12_4_;
      auVar23 = vfmsub231ps_fma(auVar32,auVar38,auVar58);
      auVar57._0_4_ = auVar29._0_4_ * auVar23._0_4_;
      auVar57._4_4_ = auVar29._4_4_ * auVar23._4_4_;
      auVar57._8_4_ = auVar29._8_4_ * auVar23._8_4_;
      auVar57._12_4_ = auVar29._12_4_ * auVar23._12_4_;
      auVar52._0_4_ = auVar33._0_4_ * auVar23._0_4_;
      auVar52._4_4_ = auVar33._4_4_ * auVar23._4_4_;
      auVar52._8_4_ = auVar33._8_4_ * auVar23._8_4_;
      auVar52._12_4_ = auVar33._12_4_ * auVar23._12_4_;
      auVar33._0_4_ = fVar45 * auVar38._0_4_;
      auVar33._4_4_ = fVar45 * auVar38._4_4_;
      auVar33._8_4_ = fVar45 * auVar38._8_4_;
      auVar33._12_4_ = fVar45 * auVar38._12_4_;
      auVar29 = vfmsub231ps_fma(auVar33,auVar9,auVar54);
      auVar33 = vfmadd231ps_fma(auVar57,auVar29,auVar55);
      auVar29 = vfmadd231ps_fma(auVar52,auVar41,auVar29);
      auVar34._0_4_ = auVar55._0_4_ * auVar22._0_4_;
      auVar34._4_4_ = auVar55._4_4_ * auVar22._4_4_;
      auVar34._8_4_ = auVar55._8_4_ * auVar22._8_4_;
      auVar34._12_4_ = auVar55._12_4_ * auVar22._12_4_;
      local_1450 = vfmsub231ps_fma(auVar34,auVar42,auVar41);
      auVar41._0_4_ = fVar44 * auVar9._0_4_;
      auVar41._4_4_ = fVar44 * auVar9._4_4_;
      auVar41._8_4_ = fVar44 * auVar9._8_4_;
      auVar41._12_4_ = fVar44 * auVar9._12_4_;
      auVar23 = vfmsub231ps_fma(auVar41,auVar27,auVar60);
      auVar61._0_4_ = fVar45 * local_1450._0_4_;
      auVar61._4_4_ = fVar45 * local_1450._4_4_;
      auVar61._8_4_ = fVar45 * local_1450._8_4_;
      auVar61._12_4_ = fVar45 * local_1450._12_4_;
      auVar41 = vfmadd231ps_fma(auVar61,local_1460,auVar58);
      auVar55 = vfmadd231ps_fma(auVar41,local_1470,auVar54);
      auVar47._8_4_ = 0x80000000;
      auVar47._0_8_ = 0x8000000080000000;
      auVar47._12_4_ = 0x80000000;
      auVar33 = vfmadd231ps_fma(auVar33,auVar23,auVar42);
      auVar41 = vandps_avx(auVar55,auVar47);
      uVar16 = auVar41._0_4_;
      local_1500._0_4_ = (float)(uVar16 ^ auVar33._0_4_);
      uVar49 = auVar41._4_4_;
      local_1500._4_4_ = (float)(uVar49 ^ auVar33._4_4_);
      uVar50 = auVar41._8_4_;
      local_1500._8_4_ = (float)(uVar50 ^ auVar33._8_4_);
      uVar51 = auVar41._12_4_;
      local_1500._12_4_ = (float)(uVar51 ^ auVar33._12_4_);
      auVar41 = vfmadd231ps_fma(auVar29,auVar22,auVar23);
      local_14f0._0_4_ = (float)(uVar16 ^ auVar41._0_4_);
      local_14f0._4_4_ = (float)(uVar49 ^ auVar41._4_4_);
      local_14f0._8_4_ = (float)(uVar50 ^ auVar41._8_4_);
      local_14f0._12_4_ = (float)(uVar51 ^ auVar41._12_4_);
      auVar33 = ZEXT416(0) << 0x20;
      auVar41 = vcmpps_avx(local_1500,auVar33,5);
      auVar22 = vcmpps_avx(local_14f0,auVar33,5);
      auVar41 = vandps_avx(auVar41,auVar22);
      auVar42._8_4_ = 0x7fffffff;
      auVar42._0_8_ = 0x7fffffff7fffffff;
      auVar42._12_4_ = 0x7fffffff;
      local_14d0 = vandps_avx(auVar55,auVar42);
      auVar22 = vcmpps_avx(auVar55,auVar33,4);
      auVar41 = vandps_avx(auVar41,auVar22);
      auVar55._0_4_ = local_1500._0_4_ + local_14f0._0_4_;
      auVar55._4_4_ = local_1500._4_4_ + local_14f0._4_4_;
      auVar55._8_4_ = local_1500._8_4_ + local_14f0._8_4_;
      auVar55._12_4_ = local_1500._12_4_ + local_14f0._12_4_;
      auVar22 = vcmpps_avx(auVar55,local_14d0,2);
      auVar33 = auVar22 & auVar41;
      if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar33[0xf] < '\0'
         ) {
        auVar41 = vandps_avx(auVar41,auVar22);
        auVar37._0_4_ = local_1450._0_4_ * auVar9._0_4_;
        auVar37._4_4_ = local_1450._4_4_ * auVar9._4_4_;
        auVar37._8_4_ = local_1450._8_4_ * auVar9._8_4_;
        auVar37._12_4_ = local_1450._12_4_ * auVar9._12_4_;
        auVar22 = vfmadd213ps_fma(auVar27,local_1460,auVar37);
        auVar22 = vfmadd213ps_fma(auVar38,local_1470,auVar22);
        local_14e0._0_4_ = (float)(uVar16 ^ auVar22._0_4_);
        local_14e0._4_4_ = (float)(uVar49 ^ auVar22._4_4_);
        local_14e0._8_4_ = (float)(uVar50 ^ auVar22._8_4_);
        local_14e0._12_4_ = (float)(uVar51 ^ auVar22._12_4_);
        fVar40 = *(float *)(ray + k * 4 + 0x60);
        auVar29._0_4_ = local_14d0._0_4_ * fVar40;
        auVar29._4_4_ = local_14d0._4_4_ * fVar40;
        auVar29._8_4_ = local_14d0._8_4_ * fVar40;
        auVar29._12_4_ = local_14d0._12_4_ * fVar40;
        auVar22 = vcmpps_avx(auVar29,local_14e0,1);
        fVar40 = *(float *)(ray + k * 4 + 0x100);
        auVar30 = ZEXT1664(CONCAT412(fVar40,CONCAT48(fVar40,CONCAT44(fVar40,fVar40))));
        auVar38._0_4_ = local_14d0._0_4_ * fVar40;
        auVar38._4_4_ = local_14d0._4_4_ * fVar40;
        auVar38._8_4_ = local_14d0._8_4_ * fVar40;
        auVar38._12_4_ = local_14d0._12_4_ * fVar40;
        auVar33 = vcmpps_avx(local_14e0,auVar38,2);
        auVar22 = vandps_avx(auVar22,auVar33);
        local_14b0 = vandps_avx(auVar41,auVar22);
        uVar16 = vmovmskps_avx(local_14b0);
        if (uVar16 != 0) {
          pSVar3 = context->scene;
          auVar41 = vrcpps_avx(local_14d0);
          auVar27._8_4_ = 0x3f800000;
          auVar27._0_8_ = 0x3f8000003f800000;
          auVar27._12_4_ = 0x3f800000;
          auVar22 = vfnmadd213ps_fma(local_14d0,auVar41,auVar27);
          auVar41 = vfmadd132ps_fma(auVar22,auVar41,auVar41);
          fVar40 = auVar41._0_4_;
          fVar44 = auVar41._4_4_;
          fVar45 = auVar41._8_4_;
          fVar46 = auVar41._12_4_;
          local_1480[0] = fVar40 * local_14e0._0_4_;
          local_1480[1] = fVar44 * local_14e0._4_4_;
          local_1480[2] = fVar45 * local_14e0._8_4_;
          local_1480[3] = fVar46 * local_14e0._12_4_;
          local_14a0[0] = fVar40 * local_1500._0_4_;
          local_14a0[1] = fVar44 * local_1500._4_4_;
          local_14a0[2] = fVar45 * local_1500._8_4_;
          local_14a0[3] = fVar46 * local_1500._12_4_;
          local_1490._0_4_ = fVar40 * local_14f0._0_4_;
          local_1490._4_4_ = fVar44 * local_14f0._4_4_;
          local_1490._8_4_ = fVar45 * local_14f0._8_4_;
          local_1490._12_4_ = fVar46 * local_14f0._12_4_;
          uVar17 = (ulong)(uVar16 & 0xff);
          do {
            local_1510 = auVar30._0_16_;
            uVar8 = 0;
            for (uVar15 = uVar17; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
              uVar8 = uVar8 + 1;
            }
            uVar16 = *(uint *)(lVar13 + uVar11 + 0x120 + uVar8 * 4);
            pGVar4 = (pSVar3->geometries).items[uVar16].ptr;
            if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                uVar15 = (ulong)(uint)((int)uVar8 * 4);
                uVar1 = *(undefined4 *)((long)local_14a0 + uVar15);
                local_12c0._4_4_ = uVar1;
                local_12c0._0_4_ = uVar1;
                local_12c0._8_4_ = uVar1;
                local_12c0._12_4_ = uVar1;
                local_12c0._16_4_ = uVar1;
                local_12c0._20_4_ = uVar1;
                local_12c0._24_4_ = uVar1;
                local_12c0._28_4_ = uVar1;
                local_12a0 = *(undefined4 *)(local_1490 + uVar15);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)((long)local_1480 + uVar15);
                local_1570.context = context->user;
                uVar1 = *(undefined4 *)(lVar13 + uVar11 + 0x130 + uVar15);
                local_1280._4_4_ = uVar1;
                local_1280._0_4_ = uVar1;
                local_1280._8_4_ = uVar1;
                local_1280._12_4_ = uVar1;
                local_1280._16_4_ = uVar1;
                local_1280._20_4_ = uVar1;
                local_1280._24_4_ = uVar1;
                local_1280._28_4_ = uVar1;
                uVar1 = *(undefined4 *)(local_1470 + uVar15);
                uVar2 = *(undefined4 *)(local_1460 + uVar15);
                local_1300._4_4_ = uVar2;
                local_1300._0_4_ = uVar2;
                local_1300._8_4_ = uVar2;
                local_1300._12_4_ = uVar2;
                local_1300._16_4_ = uVar2;
                local_1300._20_4_ = uVar2;
                local_1300._24_4_ = uVar2;
                local_1300._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(local_1450 + uVar15);
                local_12e0._4_4_ = uVar2;
                local_12e0._0_4_ = uVar2;
                local_12e0._8_4_ = uVar2;
                local_12e0._12_4_ = uVar2;
                local_12e0._16_4_ = uVar2;
                local_12e0._20_4_ = uVar2;
                local_12e0._24_4_ = uVar2;
                local_12e0._28_4_ = uVar2;
                local_1260._4_4_ = uVar16;
                local_1260._0_4_ = uVar16;
                local_1260._8_4_ = uVar16;
                local_1260._12_4_ = uVar16;
                local_1260._16_4_ = uVar16;
                local_1260._20_4_ = uVar16;
                local_1260._24_4_ = uVar16;
                local_1260._28_4_ = uVar16;
                local_1320[0] = (RTCHitN)(char)uVar1;
                local_1320[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_1320[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_1320[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_1320[4] = (RTCHitN)(char)uVar1;
                local_1320[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_1320[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_1320[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_1320[8] = (RTCHitN)(char)uVar1;
                local_1320[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_1320[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_1320[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_1320[0xc] = (RTCHitN)(char)uVar1;
                local_1320[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_1320[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_1320[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_1320[0x10] = (RTCHitN)(char)uVar1;
                local_1320[0x11] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_1320[0x12] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_1320[0x13] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_1320[0x14] = (RTCHitN)(char)uVar1;
                local_1320[0x15] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_1320[0x16] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_1320[0x17] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_1320[0x18] = (RTCHitN)(char)uVar1;
                local_1320[0x19] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_1320[0x1a] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_1320[0x1b] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_1320[0x1c] = (RTCHitN)(char)uVar1;
                local_1320[0x1d] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_1320[0x1e] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_1320[0x1f] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                uStack_129c = local_12a0;
                uStack_1298 = local_12a0;
                uStack_1294 = local_12a0;
                uStack_1290 = local_12a0;
                uStack_128c = local_12a0;
                uStack_1288 = local_12a0;
                uStack_1284 = local_12a0;
                vpcmpeqd_avx2(local_12c0,local_12c0);
                uStack_123c = (local_1570.context)->instID[0];
                local_1240 = uStack_123c;
                uStack_1238 = uStack_123c;
                uStack_1234 = uStack_123c;
                uStack_1230 = uStack_123c;
                uStack_122c = uStack_123c;
                uStack_1228 = uStack_123c;
                uStack_1224 = uStack_123c;
                uStack_121c = (local_1570.context)->instPrimID[0];
                local_1220 = uStack_121c;
                uStack_1218 = uStack_121c;
                uStack_1214 = uStack_121c;
                uStack_1210 = uStack_121c;
                uStack_120c = uStack_121c;
                uStack_1208 = uStack_121c;
                uStack_1204 = uStack_121c;
                local_1540 = local_1440;
                local_1570.valid = (int *)local_1540;
                local_1570.geometryUserPtr = pGVar4->userPtr;
                local_1570.hit = local_1320;
                local_1570.N = 8;
                local_1570.ray = (RTCRayN *)ray;
                if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar4->occlusionFilterN)(&local_1570);
                }
                auVar7 = vpcmpeqd_avx2(local_1540,_DAT_01f7b000);
                auVar24 = _DAT_01f7b020 & ~auVar7;
                if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar24 >> 0x7f,0) == '\0') &&
                      (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar24 >> 0xbf,0) == '\0') &&
                    (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar24[0x1f]) {
                  auVar7 = auVar7 ^ _DAT_01f7b020;
                }
                else {
                  p_Var5 = context->args->filter;
                  if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var5)(&local_1570);
                  }
                  auVar24 = vpcmpeqd_avx2(local_1540,_DAT_01f7b000);
                  auVar7 = auVar24 ^ _DAT_01f7b020;
                  auVar28._8_4_ = 0xff800000;
                  auVar28._0_8_ = 0xff800000ff800000;
                  auVar28._12_4_ = 0xff800000;
                  auVar28._16_4_ = 0xff800000;
                  auVar28._20_4_ = 0xff800000;
                  auVar28._24_4_ = 0xff800000;
                  auVar28._28_4_ = 0xff800000;
                  auVar24 = vblendvps_avx(auVar28,*(undefined1 (*) [32])(local_1570.ray + 0x100),
                                          auVar24);
                  *(undefined1 (*) [32])(local_1570.ray + 0x100) = auVar24;
                }
                if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar7 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar7 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar7 >> 0x7f,0) == '\0') &&
                      (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar7 >> 0xbf,0) == '\0') &&
                    (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar7[0x1f]) {
                  auVar30 = ZEXT1664(local_1510);
                  *(int *)(ray + k * 4 + 0x100) = local_1510._0_4_;
                  goto LAB_016cc67e;
                }
              }
              *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
              goto LAB_016cc76b;
            }
LAB_016cc67e:
            uVar17 = uVar17 ^ 1L << (uVar8 & 0x3f);
          } while (uVar17 != 0);
        }
      }
      auVar30 = ZEXT3264(local_1340);
      auVar31 = ZEXT3264(local_1360);
      auVar35 = ZEXT3264(local_1380);
      auVar39 = ZEXT3264(local_13a0);
      auVar43 = ZEXT3264(local_13c0);
      auVar48 = ZEXT3264(local_13e0);
      auVar53 = ZEXT3264(local_1400);
      auVar56 = ZEXT3264(local_1420);
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }